

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O2

char out_parse_entity(char *outbuf,size_t outbuf_size,char **sp,size_t *slenp)

{
  undefined8 uVar1;
  char *pcVar2;
  byte *pbVar3;
  size_t sVar4;
  size_t sVar5;
  ushort **ppuVar6;
  int iVar7;
  ulong uVar8;
  byte bVar9;
  uint html4_char;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  amp_tbl_t *local_70;
  char ampbuf [10];
  
  uVar1 = *(undefined8 *)outbuf_size;
  pcVar2 = *sp;
  if (pcVar2 == (char *)0x0) {
    bVar9 = 0;
LAB_0012e2e7:
    uVar8 = 0;
    while ('\0' < (char)bVar9) {
      ppuVar6 = __ctype_b_loc();
      if (((((*ppuVar6)[bVar9] >> 0xb & 1) == 0) && (((*ppuVar6)[bVar9] >> 10 & 1) == 0)) ||
         (8 < uVar8)) break;
      ampbuf[uVar8] = bVar9;
      if (*sp == (char *)0x0) {
        bVar9 = 0;
      }
      else {
        *sp = *sp + -1;
        pbVar3 = *(byte **)outbuf_size;
        *(byte **)outbuf_size = pbVar3 + 1;
        bVar9 = *pbVar3;
      }
      uVar8 = uVar8 + 1;
    }
    ampbuf[uVar8] = '\0';
    local_70 = (amp_tbl_t *)0x0;
    uVar8 = 0;
    uVar12 = 0x131;
    while( true ) {
      if ((0x131 < uVar8) || (uVar10 = uVar12 - uVar8, uVar12 < uVar8)) goto LAB_0012e3db;
      uVar11 = (uVar10 >> 1) + uVar8;
      iVar7 = strcmp(amp_tbl[uVar11].cname,ampbuf);
      if (iVar7 == 0) break;
      if (iVar7 < 1) {
        uVar8 = uVar8 + 1;
        if (1 < uVar10) {
          uVar8 = uVar11;
        }
      }
      else {
        if (uVar12 == 0 && uVar11 == 0) goto LAB_0012e3db;
        bVar13 = uVar11 != uVar12;
        uVar12 = uVar12 - 1;
        if (bVar13) {
          uVar12 = uVar11;
        }
      }
    }
    local_70 = amp_tbl + uVar11;
LAB_0012e3db:
    if (bVar9 == 0x3b) {
      if (*sp == (char *)0x0) {
        bVar9 = 0;
      }
      else {
        *sp = *sp + -1;
        pbVar3 = *(byte **)outbuf_size;
        *(byte **)outbuf_size = pbVar3 + 1;
        bVar9 = *pbVar3;
      }
LAB_0012e470:
      if (local_70 != (amp_tbl_t *)0x0) {
        pcVar2 = local_70->expan;
        if (pcVar2 != (char *)0x0) {
          sVar5 = strlen(pcVar2);
          sVar4 = 0x31;
          if (sVar5 < 0x31) {
            sVar4 = sVar5;
          }
          memcpy(outbuf,pcVar2,sVar4);
          outbuf[sVar4] = '\0';
          return bVar9;
        }
        html4_char = local_70->html_cval;
        goto LAB_0012e5c4;
      }
    }
    else if (local_70 != (amp_tbl_t *)0x0) {
      sVar4 = strlen(local_70->cname);
      *(undefined8 *)outbuf_size = uVar1;
      *sp = pcVar2;
      while (iVar7 = (int)sVar4, sVar4 = (size_t)(iVar7 - 1), iVar7 != 0) {
        if (*sp == (char *)0x0) {
          bVar9 = 0;
        }
        else {
          *sp = *sp + -1;
          pbVar3 = *(byte **)outbuf_size;
          *(byte **)outbuf_size = pbVar3 + 1;
          bVar9 = *pbVar3;
        }
      }
      goto LAB_0012e470;
    }
    *(undefined8 *)outbuf_size = uVar1;
    *sp = pcVar2;
    if (pcVar2 == (char *)0x0) {
      bVar9 = 0;
    }
    else {
      *sp = pcVar2 + -1;
      pbVar3 = *(byte **)outbuf_size;
      *(byte **)outbuf_size = pbVar3 + 1;
      bVar9 = *pbVar3;
    }
    outbuf[0] = '&';
    outbuf[1] = '\0';
  }
  else {
    *sp = pcVar2 + -1;
    pbVar3 = *(byte **)outbuf_size;
    *(byte **)outbuf_size = pbVar3 + 1;
    bVar9 = *pbVar3;
    if (bVar9 != 0x23) goto LAB_0012e2e7;
    html4_char = 0;
    if (*sp == (char *)0x0) {
      bVar9 = 0;
LAB_0012e4e8:
      while (-1 < (char)bVar9) {
        ppuVar6 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar6 + (ulong)bVar9 * 2 + 1) & 8) == 0) goto LAB_0012e599;
        html4_char = ((uint)bVar9 + html4_char * 10) - 0x30;
        bVar9 = 0;
        if (*sp != (char *)0x0) {
          *sp = *sp + -1;
          pbVar3 = *(byte **)outbuf_size;
          *(byte **)outbuf_size = pbVar3 + 1;
          bVar9 = *pbVar3;
        }
      }
    }
    else {
      *sp = *sp + -1;
      pbVar3 = *(byte **)outbuf_size;
      *(byte **)outbuf_size = pbVar3 + 1;
      bVar9 = *pbVar3;
      html4_char = 0;
      if ((bVar9 & 0xdf) != 0x58) goto LAB_0012e4e8;
      html4_char = 0;
      if (*sp == (char *)0x0) {
        bVar9 = 0;
      }
      else {
        *sp = *sp + -1;
        pbVar3 = *(byte **)outbuf_size;
        *(byte **)outbuf_size = pbVar3 + 1;
        bVar9 = *pbVar3;
      }
      ppuVar6 = __ctype_b_loc();
      while (((*ppuVar6)[bVar9] >> 0xc & 1) != 0) {
        if (((char)bVar9 < '\0') || (((*ppuVar6)[bVar9] & 0x800) == 0)) {
          if ((byte)(bVar9 + 0x9f) < 6) {
            iVar7 = (char)bVar9 + -0x57;
          }
          else {
            iVar7 = (char)bVar9 + -0x37;
          }
        }
        else {
          iVar7 = bVar9 - 0x30;
        }
        html4_char = html4_char * 0x10 + iVar7;
        bVar9 = 0;
        if (*sp != (char *)0x0) {
          *sp = *sp + -1;
          pbVar3 = *(byte **)outbuf_size;
          *(byte **)outbuf_size = pbVar3 + 1;
          bVar9 = *pbVar3;
        }
      }
LAB_0012e599:
      if (bVar9 == 0x3b) {
        if (*sp == (char *)0x0) {
          bVar9 = 0;
        }
        else {
          *sp = *sp + -1;
          pbVar3 = *(byte **)outbuf_size;
          *(byte **)outbuf_size = pbVar3 + 1;
          bVar9 = *pbVar3;
        }
      }
    }
LAB_0012e5c4:
    os_xlat_html4(html4_char,outbuf,0x32);
  }
  return bVar9;
}

Assistant:

static char out_parse_entity(char *outbuf, size_t outbuf_size,
                             char **sp, size_t *slenp)
{
    char  ampbuf[10];
    char *dst;
    char *orig_s;
    size_t orig_slen;
    const struct amp_tbl_t *ampptr;
    size_t lo, hi, cur;
    char  c;

    /* 
     *   remember where the part after the '&' begins, so we can come back
     *   here later if necessary 
     */
    orig_s = *sp;
    orig_slen = *slenp;

    /* get the character after the ampersand */
    c = nextout(sp, slenp);

    /* if it's numeric, parse the number */
    if (c == '#')
    {
        uint val;
        
        /* skip the '#' */
        c = nextout(sp, slenp);

        /* check for hex */
        if (c == 'x' || c == 'X')
        {
            /* skip the 'x' */
            c = nextout(sp, slenp);

            /* read the hex number */
            for (val = 0 ; isxdigit((uchar)c) ; c = nextout(sp, slenp))
            {
                /* accumulate the current digit into the value */
                val *= 16;
                if (outisdg(c))
                    val += c - '0';
                else if (c >= 'a' && c <= 'f')
                    val += c - 'a' + 10;
                else
                    val += c - 'A' + 10;
            }
        }
        else
        {
            /* read the number */
            for (val = 0 ; outisdg(c) ; c = nextout(sp, slenp))
            {
                /* accumulate the current digit into the value */
                val *= 10;
                val += c - '0';
            }
        }
        
        /* if we found a ';' at the end, skip it */
        if (c == ';')
            c = nextout(sp, slenp);
        
        /* translate the character into the output buffer */
        os_xlat_html4(val, outbuf, outbuf_size);
        
        /* we're done with this character */
        return c;
    }

    /*
     *   Parse the sequence after the '&'.  Parse up to the closing
     *   semicolon, or any non-alphanumeric, or until we fill up the buffer.
     */
    for (dst = ampbuf ;
         c != '\0' && (outisdg(c) || outisal(c))
             && dst < ampbuf + sizeof(ampbuf) - 1 ;
         *dst++ = c, c = nextout(sp, slenp)) ;
    
    /* null-terminate the name */
    *dst = '\0';
    
    /* do a binary search for the name */
    lo = 0;
    hi = sizeof(amp_tbl)/sizeof(amp_tbl[0]) - 1;
    for (;;)
    {
        int diff;
        
        /* if we've converged, look no further */
        if (lo > hi || lo >= sizeof(amp_tbl)/sizeof(amp_tbl[0]))
        {
            ampptr = 0;
            break;
        }
        
        /* split the difference */
        cur = lo + (hi - lo)/2;
        ampptr = &amp_tbl[cur];
        
        /* see where we are relative to the target item */
        diff = strcmp(ampptr->cname, ampbuf);
        if (diff == 0)
        {
            /* this is it */
            break;
        }
        else if (diff > 0)
        {
            /* make sure we don't go off the end */
            if (cur == hi && cur == 0)
            {
                /* we've failed to find it */
                ampptr = 0;
                break;
            }
            
            /* this one is too high - check the lower half */
            hi = (cur == hi ? hi - 1 : cur);
        }
        else
        {
            /* this one is too low - check the upper half */
            lo = (cur == lo ? lo + 1 : cur);
        }
    }
    
    /* skip to the appropriate next character */
    if (c == ';')
    {
        /* name ended with semicolon - skip the semicolon */
        c = nextout(sp, slenp);
    }
    else if (ampptr != 0)
    {
        int skipcnt;
        
        /* found the name - skip its exact length */
        skipcnt = strlen(ampptr->cname);
        for (*sp = orig_s, *slenp = orig_slen ; skipcnt != 0 ;
             c = nextout(sp, slenp), --skipcnt) ;
    }
    
    /* if we found the entry, write out the character */
    if (ampptr != 0)
    {
        /* 
         *   if this one has an external mapping table entry, use the mapping
         *   table entry; otherwise, use the default OS routine mapping 
         */
        if (ampptr->expan != 0)
        {
            /* 
             *   we have an explicit expansion from the mapping table file -
             *   use it 
             */
            size_t copylen = strlen(ampptr->expan);
            if (copylen > outbuf_size - 1)
                copylen = outbuf_size - 1;

            memcpy(outbuf, ampptr->expan, copylen);
            outbuf[copylen] = '\0';
        }
        else
        {
            /* 
             *   there's no mapping table expansion - use the default OS code
             *   expansion 
             */
            os_xlat_html4(ampptr->html_cval, outbuf, outbuf_size);
        }
    }
    else
    {
        /* 
         *   didn't find it - output the '&' literally, then back up and
         *   output the entire sequence following 
         */
        *sp = orig_s;
        *slenp = orig_slen;
        c = nextout(sp, slenp);

        /* fill in the '&' return value */
        outbuf[0] = '&';
        outbuf[1] = '\0';
    }

    /* return the next character */
    return c;
}